

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidload.c
# Opt level: O0

FT_Error parse_expansion_factor(CID_Face face,CID_Parser *parser)

{
  int iVar1;
  CID_FaceDict pCVar2;
  FT_Fixed FVar3;
  CID_FaceDict dict;
  CID_Parser *parser_local;
  CID_Face face_local;
  
  if ((-1 < parser->num_dict) && (parser->num_dict < (face->cid).num_dicts)) {
    pCVar2 = (face->cid).font_dicts;
    iVar1 = parser->num_dict;
    FVar3 = (*(parser->root).funcs.to_fixed)(&parser->root,0);
    pCVar2[iVar1].expansion_factor = FVar3;
    pCVar2[iVar1].private_dict.expansion_factor = pCVar2[iVar1].expansion_factor;
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  parse_expansion_factor( CID_Face     face,
                          CID_Parser*  parser )
  {
    CID_FaceDict  dict;


    if ( parser->num_dict >= 0 && parser->num_dict < face->cid.num_dicts )
    {
      dict = face->cid.font_dicts + parser->num_dict;

      dict->expansion_factor              = cid_parser_to_fixed( parser, 0 );
      dict->private_dict.expansion_factor = dict->expansion_factor;
    }

    return FT_Err_Ok;
  }